

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O2

double __thiscall HyperLogLog::Assess(HyperLogLog *this)

{
  int j;
  int iVar1;
  long lVar2;
  int j_1;
  double dVar3;
  
  dVar3 = 0.0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    dVar3 = dVar3 + 1.0 / (double)(1 << (this->hllv[lVar2] & 0x1f));
  }
  dVar3 = (1.0 / dVar3) * 172.288;
  if (dVar3 < 40.0) {
    iVar1 = 0;
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      iVar1 = iVar1 + (uint)(this->hllv[lVar2] == '\0');
    }
    if (iVar1 != 0) {
      dVar3 = log(16.0 / (double)iVar1);
      dVar3 = dVar3 * 16.0;
    }
  }
  return dVar3;
}

Assistant:

double HyperLogLog::Assess()
{
    /*
    * First, compute the "indicator" of the m=16 registers
    * Z = 1 / sum (1 / 2^hll[j])
    * The indicator is NOT the same as the harmonic mean. The relation is:
    * harmonic_mean = m * Z
    */
    double divider = 0;
    for (int j = 0; j < 16; j++) {
        divider += 1.0 / ((double)(1 << hllv[j]));
    }
    double Z = 1.0 / divider;

    /*
    * Then, compute E using a precomputed coefficient to correct the bias of the formula
    * E = alpha_m * (m^2) * Z
    * For m = 16, use the precomputed value alpha_m = 0.673
    * 0.673 * (16^2) = 0.673*256 = 172.288
     */
    double E = Z * 172.288;

    /*
    * For small values (E < (5/2)*m , use Linear counting
    */
    if (E < 40.0) {
        int V = 0;
        for (int j = 0; j < 16; j++) {
            if (hllv[j] == 0) {
                V += 1;
            }
        }
        if (V > 0) {
            E = 16 * log(16.0 / (double)V);
        }
    }

    return E;
}